

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * vector_representation_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                   *vector)

{
  long lVar1;
  string *psVar2;
  long *plVar3;
  size_type *psVar4;
  pointer psVar5;
  string elements_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  psVar5 = (vector->
           super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = __return_storage_ptr__;
  if (psVar5 != (vector->
                super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (psVar5 != (vector->
                    super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)&local_50);
      }
      (*((psVar5->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Instance
        [2])(&local_78);
      std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != (vector->
                       super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::operator+(&local_78,"[",&local_50);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  psVar2 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (local_58->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&local_58->field_2 + 8) = lVar1;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar3;
    (local_58->field_2)._M_allocated_capacity = *psVar4;
  }
  local_58->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return psVar2;
}

Assistant:

std::string vector_representation(const std::vector<std::shared_ptr<Instance>>& vector) {
    std::string elements_str;
    for (auto it = vector.begin(); it != vector.end(); it++) {
        if (it != vector.begin())
            elements_str += ",";
        elements_str += (*it)->representation();
    }
    return "[" + elements_str + "]";
}